

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::ContextMenu(BoardView *this)

{
  Annotations *this_00;
  float fVar1;
  int iVar2;
  pointer pAVar3;
  long *plVar4;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ImVec2 IVar12;
  BoardView *pBVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  Annotation *ann;
  pointer pAVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar18;
  long lVar19;
  long lVar20;
  shared_ptr<Pin> *pin_1;
  long *plVar21;
  shared_ptr<Component> *part;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *__r;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar23;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar25;
  undefined8 uVar24;
  bool dummy;
  BoardView *local_170;
  float local_168;
  allocator<char> local_161;
  double local_160;
  double local_158;
  long local_150;
  undefined1 local_148 [24];
  ImVec2 local_130;
  undefined1 local_128 [32];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  long local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  long local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  array<ImVec2,_4UL> poly;
  _Alloc_hider local_b0;
  _Alloc_hider local_90;
  size_type local_88;
  _Alloc_hider local_70;
  size_type local_68;
  
  dummy = true;
  if ((ContextMenu()::pin_abi_cxx11_ == '\0') &&
     (iVar15 = __cxa_guard_acquire(&ContextMenu()::pin_abi_cxx11_), iVar15 != 0)) {
    ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p = (pointer)&ContextMenu()::pin_abi_cxx11_.field_2
    ;
    ContextMenu()::pin_abi_cxx11_._M_string_length = 0;
    ContextMenu()::pin_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,&ContextMenu()::pin_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ContextMenu()::pin_abi_cxx11_);
  }
  if ((ContextMenu()::partn_abi_cxx11_ == '\0') &&
     (iVar15 = __cxa_guard_acquire(&ContextMenu()::partn_abi_cxx11_), iVar15 != 0)) {
    ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p =
         (pointer)&ContextMenu()::partn_abi_cxx11_.field_2;
    ContextMenu()::partn_abi_cxx11_._M_string_length = 0;
    ContextMenu()::partn_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,&ContextMenu()::partn_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ContextMenu()::partn_abi_cxx11_);
  }
  if ((ContextMenu()::net_abi_cxx11_ == '\0') &&
     (iVar15 = __cxa_guard_acquire(&ContextMenu()::net_abi_cxx11_), iVar15 != 0)) {
    ContextMenu()::net_abi_cxx11_._M_dataplus._M_p = (pointer)&ContextMenu()::net_abi_cxx11_.field_2
    ;
    ContextMenu()::net_abi_cxx11_._M_string_length = 0;
    ContextMenu()::net_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,&ContextMenu()::net_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ContextMenu()::net_abi_cxx11_);
  }
  IVar12 = ScreenToCoord(this,(this->m_showContextMenuPos).x,(this->m_showContextMenuPos).y,1.0);
  local_148._8_4_ = extraout_XMM0_Dc;
  local_148._0_4_ = IVar12.x;
  local_148._4_4_ = IVar12.y;
  local_148._12_4_ = extraout_XMM0_Dd;
  fVar22 = truncf(IVar12.x);
  local_170 = (BoardView *)CONCAT44(local_170._4_4_,fVar22);
  local_108 = (float)local_148._4_4_;
  fStack_104 = (float)local_148._4_4_;
  fStack_100 = (float)local_148._4_4_;
  fStack_fc = (float)local_148._4_4_;
  fVar22 = truncf((float)local_148._4_4_);
  local_150 = CONCAT44(local_150._4_4_,fVar22);
  local_168 = DPIF(50.0);
  poly._M_elems[0].y = DPIF(50.0);
  poly._M_elems[0].x = local_168;
  local_128._0_4_ = 0.0;
  local_128._4_4_ = 0.0;
  ImGui::SetNextWindowPos(poly._M_elems,0,(ImVec2 *)local_128);
  ImGui::PushStyleVar(4,1.0);
  bVar14 = ImGui::BeginPopupModal("Annotations",&dummy,0x40);
  if (!bVar14) goto LAB_00111fb1;
  if (this->m_showContextMenu == true) {
    ContextMenu::contextbuf[0] = '\0';
    this->m_showContextMenu = false;
    pAVar3 = (this->m_annotations).annotations.
             super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pAVar17 = (this->m_annotations).annotations.
                   super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
                   super__Vector_impl_data._M_start; pAVar17 != pAVar3; pAVar17 = pAVar17 + 1) {
      pAVar17->hovered = false;
    }
  }
  local_158 = (double)local_170._0_4_;
  local_160 = (double)(float)local_150;
  local_168 = (float)this->m_pinDiameter * (float)this->m_pinDiameter;
  local_170 = this;
  iVar15 = (*this->m_board->_vptr_Board[4])();
  plVar21 = *(long **)CONCAT44(extraout_var,iVar15);
  plVar4 = (long *)((undefined8 *)CONCAT44(extraout_var,iVar15))[1];
  local_150 = 0;
  for (; uVar25 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20), plVar21 != plVar4;
      plVar21 = plVar21 + 2) {
    std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Component,void>
              ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
               (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)(*plVar21 + 0x68));
    if (local_e8 == 0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
LAB_00111847:
      lVar19 = *plVar21;
      fVar22 = *(float *)(lVar19 + 0x50) - (float)local_148._0_4_;
      fVar23 = *(float *)(lVar19 + 0x54) - local_108;
      fVar22 = fVar22 * fVar22 + fVar23 * fVar23;
      if (fVar22 < local_168) {
        local_168 = fVar22;
        local_150 = lVar19;
      }
    }
    else {
      iVar15 = *(int *)(local_e8 + 8);
      iVar2 = local_170->m_current_side;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
      if ((iVar15 == 2) || (iVar15 == iVar2)) goto LAB_00111847;
    }
  }
  if (local_150 == 0) {
    iVar15 = (*local_170->m_board->_vptr_Board[3])();
    p_Var5 = (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)
             ((undefined8 *)CONCAT44(extraout_var_00,iVar15))[1];
    for (__r = *(__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> **)
                CONCAT44(extraout_var_00,iVar15);
        uVar25 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20), __r != p_Var5;
        __r = __r + 1) {
      std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Component,void>
                ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_f8,__r);
      if (local_f8 == 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
LAB_00111a2b:
        peVar6 = __r->_M_ptr;
        poly._M_elems[2] = (peVar6->outline)._M_elems[2];
        poly._M_elems[3] = (peVar6->outline)._M_elems[3];
        poly._M_elems[0] = (peVar6->outline)._M_elems[0];
        poly._M_elems[1] = (peVar6->outline)._M_elems[1];
        bVar14 = false;
        lVar19 = 3;
        for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
          fVar22 = poly._M_elems[lVar20].y;
          fVar23 = poly._M_elems[lVar19].y;
          if ((local_108 < fVar22 == fVar23 <= local_108) &&
             (fVar1 = poly._M_elems[lVar20].x,
             (float)local_148._0_4_ <
             ((local_108 - fVar22) * (poly._M_elems[lVar19].x - fVar1)) / (fVar23 - fVar22) + fVar1)
             ) {
            bVar14 = !bVar14;
          }
          lVar19 = lVar20;
        }
        if (bVar14) {
          std::__cxx11::string::_M_assign((string *)&ContextMenu()::partn_abi_cxx11_);
          ImGui::SameLine(0.0,-1.0);
        }
      }
      else {
        iVar15 = *(int *)(local_f8 + 8);
        iVar2 = local_170->m_current_side;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
        if ((iVar15 == 2) || (iVar15 == iVar2)) goto LAB_00111a2b;
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&ContextMenu()::pin_abi_cxx11_);
    std::__cxx11::string::_M_assign((string *)&ContextMenu()::partn_abi_cxx11_);
    std::__cxx11::string::_M_assign((string *)&ContextMenu()::net_abi_cxx11_);
  }
  pBVar13 = local_170;
  iVar15 = local_170->m_annotation_clicked_id;
  uVar9 = 0x42;
  uVar24 = 0x20;
  uVar7 = 0x20;
  uVar8 = 0x5d;
  if (-1 < (long)iVar15) {
    Annotation::Annotation
              ((Annotation *)&poly,
               (local_170->m_annotations).annotations.
               super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
               super__Vector_impl_data._M_start + iVar15);
    if (pBVar13->m_annotationedit_retain == false) {
      snprintf(ContextMenu::contextbuf,0x2800,"%s",poly._M_elems[1]);
      pBVar13->m_annotationnew_retain = false;
      pBVar13->m_annotationedit_retain = true;
    }
    uVar10 = uVar9;
    if (pBVar13->m_current_side == 0) {
      uVar10 = 0x54;
    }
    uVar16 = uVar7;
    uVar11 = uVar24;
    if ((local_88 != 0) && (uVar16 = uVar8, uVar11 = 0x5b, local_68 == 0)) {
      uVar16 = uVar7;
      uVar11 = uVar24;
    }
    ImGui::Text("%c(%0.0f,%0.0f) %s, %s%c%s%c",SUB84(local_158,0),SUB84(local_160,0),uVar10,
                local_b0._M_p,local_90._M_p,uVar11,local_70._M_p,CONCAT44(uVar25,uVar16));
    iVar15 = DPI(600);
    fVar22 = ImGui::GetTextLineHeight();
    local_128._4_4_ = fVar22 * 8.0;
    local_128._0_4_ = (float)iVar15;
    uVar25 = 0;
    ImGui::InputTextMultiline
              ("##annotationedit",ContextMenu::contextbuf,0x2800,(ImVec2 *)local_128,0,
               (ImGuiInputTextCallback)0x0,ContextMenu::contextbuf);
    local_130.x = 0.0;
    local_130.y = 0.0;
    bVar14 = ImGui::Button("Update##1",&local_130);
    if (bVar14) {
LAB_00111bc8:
      this_00 = &local_170->m_annotations;
      local_170->m_annotationedit_retain = false;
      Annotations::Update(this_00,(local_170->m_annotations).annotations.
                                  super__Vector_base<Annotation,_std::allocator<Annotation>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [local_170->m_annotation_clicked_id].id,ContextMenu::contextbuf);
      Annotations::GenerateList(this_00);
      local_170->m_needsRedraw = true;
      ImGui::CloseCurrentPopup();
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"Validate",&local_161);
      bVar14 = KeyBindings::isPressed(&local_170->keybindings,(string *)local_128);
      std::__cxx11::string::~string((string *)local_128);
      if (bVar14) goto LAB_00111bc8;
    }
    ImGui::SameLine(0.0,-1.0);
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0.0;
    bVar14 = ImGui::Button("Cancel##1",(ImVec2 *)local_128);
    if (bVar14) {
      ImGui::CloseCurrentPopup();
      local_170->m_annotationnew_retain = false;
    }
    ImGui::Separator();
    Annotation::~Annotation((Annotation *)&poly);
    iVar15 = local_170->m_annotation_clicked_id;
  }
  this = local_170;
  if ((iVar15 < 0) && (local_170->m_annotationnew_retain == false)) {
    uVar10 = uVar9;
    if (local_170->m_current_side == 0) {
      uVar10 = 0x54;
    }
    uVar16 = uVar8;
    uVar11 = 0x5b;
    if (ContextMenu()::pin_abi_cxx11_._M_string_length == 0 ||
        ContextMenu()::partn_abi_cxx11_._M_string_length == 0) {
      uVar16 = uVar7;
      uVar11 = uVar24;
    }
    uVar24 = CONCAT44(uVar25,uVar16);
    ImGui::Text("%c(%0.0f,%0.0f) %s %s%c%s%c",SUB84(local_158,0),SUB84(local_160,0),uVar10,
                ContextMenu()::net_abi_cxx11_._M_dataplus._M_p,
                ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p,uVar11,
                ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p,uVar24);
    uVar25 = (undefined4)((ulong)uVar24 >> 0x20);
    iVar15 = this->m_annotation_clicked_id;
  }
  if (iVar15 < 0) {
    bVar18 = this->m_annotationnew_retain;
LAB_00111d35:
    if (bVar18 == 0) {
      ContextMenu::contextbufnew[0] = '\0';
      this->m_annotationnew_retain = true;
      this->m_annotationedit_retain = false;
      this->m_annotation_clicked_id = -1;
    }
    if (this->m_current_side == 0) {
      uVar9 = 0x54;
    }
    uVar16 = 0x5b;
    if (ContextMenu()::pin_abi_cxx11_._M_string_length == 0 ||
        ContextMenu()::partn_abi_cxx11_._M_string_length == 0) {
      uVar8 = uVar7;
      uVar16 = uVar7;
    }
    ImGui::Text("Create new annotation for: %c(%0.0f,%0.0f) %s %s%c%s%c",SUB84(local_158,0),
                SUB84(local_160,0),uVar9,ContextMenu()::net_abi_cxx11_._M_dataplus._M_p,
                ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p,(ulong)uVar16,
                ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p,CONCAT44(uVar25,uVar8));
    ImGui::Spacing();
    iVar15 = DPI(600);
    local_148._0_4_ = (float)iVar15;
    fVar22 = ImGui::GetTextLineHeight();
    poly._M_elems[0].y = fVar22 * 8.0;
    poly._M_elems[0].x = (float)local_148._0_4_;
    ImGui::InputTextMultiline
              ("New##annotationnew",ContextMenu::contextbufnew,0x2800,poly._M_elems,0,
               (ImGuiInputTextCallback)0x0,ContextMenu::contextbufnew);
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0.0;
    bVar14 = ImGui::Button("Apply##1",(ImVec2 *)local_128);
    if (!bVar14) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&poly,"Validate",(allocator<char> *)&local_130);
      bVar14 = KeyBindings::isPressed(&this->keybindings,(string *)&poly);
      std::__cxx11::string::~string((string *)&poly);
      if (!bVar14) goto LAB_00111ed5;
    }
    this->m_annotationnew_retain = false;
    if (this->debug == true) {
      fprintf(_stderr,"DATA:\'%s\'\n\n",ContextMenu::contextbufnew);
    }
    Annotations::Add(&this->m_annotations,this->m_current_side,local_158,local_160,
                     ContextMenu()::net_abi_cxx11_._M_dataplus._M_p,
                     ContextMenu()::partn_abi_cxx11_._M_dataplus._M_p,
                     ContextMenu()::pin_abi_cxx11_._M_dataplus._M_p,ContextMenu::contextbufnew);
    Annotations::GenerateList(&this->m_annotations);
    this->m_needsRedraw = true;
    ImGui::CloseCurrentPopup();
  }
  else {
    poly._M_elems[0].x = 0.0;
    poly._M_elems[0].y = 0.0;
    bVar14 = ImGui::Button("Add New##1",poly._M_elems);
    bVar18 = this->m_annotationnew_retain;
    if ((bVar14) || ((bVar18 & 1) != 0)) goto LAB_00111d35;
    ImGui::SameLine(0.0,-1.0);
  }
LAB_00111ed5:
  if (-1 < this->m_annotation_clicked_id) {
    poly._M_elems[0].x = 0.0;
    poly._M_elems[0].y = 0.0;
    bVar14 = ImGui::Button("Remove",poly._M_elems);
    if (bVar14) {
      Annotations::Remove(&this->m_annotations,
                          (this->m_annotations).annotations.
                          super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
                          super__Vector_impl_data._M_start[this->m_annotation_clicked_id].id);
      Annotations::GenerateList(&this->m_annotations);
      this->m_needsRedraw = true;
      ImGui::CloseCurrentPopup();
    }
  }
  ImGui::SameLine(0.0,-1.0);
  local_128._0_4_ = 0.0;
  local_128._4_4_ = 0.0;
  bVar14 = ImGui::Button("Cancel##2",(ImVec2 *)local_128);
  if (bVar14) {
LAB_00111f9f:
    this->m_annotationnew_retain = false;
    this->m_annotationedit_retain = false;
    ImGui::CloseCurrentPopup();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&poly,"CloseDialog",(allocator<char> *)&local_130);
    bVar14 = KeyBindings::isPressed(&this->keybindings,(string *)&poly);
    std::__cxx11::string::~string((string *)&poly);
    if (bVar14) goto LAB_00111f9f;
  }
  ImGui::EndPopup();
LAB_00111fb1:
  ImGui::PopStyleVar(1);
  if (dummy == false) {
    this->m_annotationnew_retain = false;
    this->m_annotationedit_retain = false;
  }
  return;
}

Assistant:

void BoardView::ContextMenu(void) {
	bool dummy                       = true;
	static char contextbuf[10240]    = "";
	static char contextbufnew[10240] = "";
	static std::string pin, partn, net;
	double tx, ty;

	ImVec2 pos = ScreenToCoord(m_showContextMenuPos.x, m_showContextMenuPos.y);

	/*
	 * So we don't have dozens of near-same-spot annotation points, we truncate
	 * back to integer levels, which still gives us 1-thou precision
	 */
	tx = trunc(pos.x);
	ty = trunc(pos.y);

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(DPIF(50), DPIF(50)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Annotations", &dummy, ImGuiWindowFlags_AlwaysAutoResize)) {

		if (m_showContextMenu) {
			contextbuf[0]      = 0;
			m_showContextMenu  = false;
			for (auto &ann : m_annotations.annotations) ann.hovered = false;
		}

		/*
		 * For the new annotation possibility, we need to detect our various
		 * attributes that we can bind to, such as pin, net, part
		 */
		{
			/*
			 * we're going to go through all the possible items we can annotate at this position and offer them
			 */

			float min_dist = m_pinDiameter * 1.0f;

			/*
			 * find the closest pin, starting at no more than
			 * 1 radius away
			 */
			min_dist *= min_dist; // all distance squared
			Pin *selection = nullptr;
			for (auto &pin : m_board->Pins()) {
				if (BoardElementIsVisible(pin->component)) {
					float dx   = pin->position.x - pos.x;
					float dy   = pin->position.y - pos.y;
					float dist = dx * dx + dy * dy;
					if (dist < min_dist) {
						selection = pin.get();
						min_dist  = dist;
					}
				}
			}

			/*
			 * If there was a pin selected, we can extract net/part off it
			 */

			if (selection != nullptr) {
				pin   = selection->name;
				partn = selection->component->name;
				net   = selection->net->name;
			} else {

				/*
				 * ELSE if we didn't get a pin selected, we can still
				 * check for a part.
				 *
				 * There is a problem where we can be on two parts
				 * but haven't decided what to do in such a situation
				 */

				for (auto &part : m_board->Components()) {
					int hit = 0;
					//					auto p_part = part.get();

					if (!BoardElementIsVisible(part)) continue;

					// Work out if the point is inside the hull
					{
						auto poly = part->outline;

						for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
							if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
							    (pos.x < (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
								hit = !hit;
						}
					} // hull test
					if (hit) {
						partn = part->name;

						ImGui::SameLine();
					}

				} // for each part
			}

			{

				/*
				 * For existing annotations
				 */
				if (m_annotation_clicked_id >= 0) {
					if (m_annotationedit_retain || (m_annotation_clicked_id >= 0)) {
						Annotation ann = m_annotations.annotations[m_annotation_clicked_id];
						if (!m_annotationedit_retain) {
							snprintf(contextbuf, sizeof(contextbuf), "%s", ann.note.c_str());
							m_annotationedit_retain = true;
							m_annotationnew_retain  = false;
						}

						ImGui::Text("%c(%0.0f,%0.0f) %s, %s%c%s%c",
						            m_current_side ? 'B' : 'T',
						            tx,
						            ty,
						            ann.net.c_str(),
						            ann.part.c_str(),
						            ann.part.size() && ann.pin.size() ? '[' : ' ',
						            ann.pin.c_str(),
						            ann.part.size() && ann.pin.size() ? ']' : ' ');
						ImGui::InputTextMultiline("##annotationedit",
						                          contextbuf,
						                          sizeof(contextbuf),
						                          ImVec2(DPI(600), ImGui::GetTextLineHeight() * 8),
						                          0,
						                          NULL,
						                          contextbuf);

						if (ImGui::Button("Update##1") || keybindings.isPressed("Validate")) {
							m_annotationedit_retain = false;
							m_annotations.Update(m_annotations.annotations[m_annotation_clicked_id].id, contextbuf);
							m_annotations.GenerateList();
							m_needsRedraw      = true;
							ImGui::CloseCurrentPopup();
						}
						ImGui::SameLine();
						if (ImGui::Button("Cancel##1")) {
							ImGui::CloseCurrentPopup();
							m_annotationnew_retain = false;
						}
						ImGui::Separator();
					}
				}

				/*
				 * For generating a new annotation
				 */
				if ((m_annotation_clicked_id < 0) && (m_annotationnew_retain == false)) {
					ImGui::Text("%c(%0.0f,%0.0f) %s %s%c%s%c",
					            m_current_side ? 'B' : 'T',
					            tx,
					            ty,
					            net.c_str(),
					            partn.c_str(),
					            partn.empty() || pin.empty() ? ' ' : '[',
					            pin.c_str(),
					            partn.empty() || pin.empty() ? ' ' : ']');
				}
				if ((m_annotation_clicked_id < 0) || ImGui::Button("Add New##1") || m_annotationnew_retain) {
					if (m_annotationnew_retain == false) {
						contextbufnew[0]        = 0;
						m_annotationnew_retain  = true;
						m_annotation_clicked_id = -1;
						m_annotationedit_retain = false;
					}

					ImGui::Text("Create new annotation for: %c(%0.0f,%0.0f) %s %s%c%s%c",
					            m_current_side ? 'B' : 'T',
					            tx,
					            ty,
					            net.c_str(),
					            partn.c_str(),
					            partn.empty() || pin.empty() ? ' ' : '[',
					            pin.c_str(),
					            partn.empty() || pin.empty() ? ' ' : ']');
					ImGui::Spacing();
					ImGui::InputTextMultiline("New##annotationnew",
					                          contextbufnew,
					                          sizeof(contextbufnew),
					                          ImVec2(DPI(600), ImGui::GetTextLineHeight() * 8),
					                          0,
					                          NULL,
					                          contextbufnew);

					if (ImGui::Button("Apply##1") || keybindings.isPressed("Validate")) {
						m_annotationnew_retain = false;
						if (debug) fprintf(stderr, "DATA:'%s'\n\n", contextbufnew);

						m_annotations.Add(m_current_side, tx, ty, net.c_str(), partn.c_str(), pin.c_str(), contextbufnew);
						m_annotations.GenerateList();
						m_needsRedraw = true;

						ImGui::CloseCurrentPopup();
					}
					/*
					ImGui::SameLine();
					if (ImGui::Button("Cancel")) {
					    ImGui::CloseCurrentPopup();
					    m_annotationnew_retain = false;
					}
					*/
				} else {
					ImGui::SameLine();
				}

				if ((m_annotation_clicked_id >= 0) && (ImGui::Button("Remove"))) {
					m_annotations.Remove(m_annotations.annotations[m_annotation_clicked_id].id);
					m_annotations.GenerateList();
					m_needsRedraw = true;
					ImGui::CloseCurrentPopup();
				}
			}

			// the position.
		}

		ImGui::SameLine();
		if (ImGui::Button("Cancel##2") || keybindings.isPressed("CloseDialog")) {
			m_annotationnew_retain  = false;
			m_annotationedit_retain = false;
			ImGui::CloseCurrentPopup();
		}
		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();

	/** if the dialog was closed by using the (X) icon **/
	if (!dummy) {
		m_annotationnew_retain  = false;
		m_annotationedit_retain = false;
	}
}